

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

void FastPForLib::Simple16<false>::unpack5_2_6_3(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x17 & 0x1f;
  puVar2[1] = *puVar1 >> 0x12 & 0x1f;
  puVar2[2] = *puVar1 >> 0xc & 0x3f;
  puVar2[3] = *puVar1 >> 6 & 0x3f;
  puVar2[4] = *puVar1 & 0x3f;
  *in = puVar1 + 1;
  *out = puVar2 + 5;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack5_2_6_3(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 23) & 0x1f;
  pout[1] = (pin[0] >> 18) & 0x1f;

  pout[2] = (pin[0] >> 12) & 0x3f;
  pout[3] = (pin[0] >> 6) & 0x3f;
  pout[4] = pin[0] & 0x3f;

  *in = pin + 1;
  *out = pout + 5;
}